

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_flush(Byte *compr,uLong *comprLen)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_90;
  int local_88;
  Byte *local_78;
  undefined4 local_70;
  uLong local_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  sVar2 = strlen(hello);
  local_50 = 0;
  uStack_48 = 0;
  local_40 = 0;
  uVar1 = deflateInit_(&local_90,0xffffffffffffffff,"1.2.11",0x70);
  if (uVar1 == 0) {
    local_90 = hello;
    local_88 = 3;
    local_70 = (undefined4)*comprLen;
    local_78 = compr;
    uVar1 = deflate(&local_90,3);
    if (uVar1 == 0) {
      compr[3] = compr[3] + '\x01';
      local_88 = (int)sVar2 + -2;
      uVar1 = deflate(&local_90,4);
      if (uVar1 < 2) {
        uVar1 = deflateEnd(&local_90);
        if (uVar1 == 0) {
          *comprLen = local_68;
          return;
        }
        pcVar3 = "deflateEnd";
        goto LAB_00102d51;
      }
    }
    pcVar3 = "deflate";
  }
  else {
    pcVar3 = "deflateInit";
  }
LAB_00102d51:
  fprintf(_stderr,"%s error: %d\n",pcVar3,(ulong)uVar1);
  exit(1);
}

Assistant:

void test_flush(compr, comprLen)
    Byte *compr;
    uLong *comprLen;
{
    z_stream c_stream; /* compression stream */
    int err;
    uInt len = (uInt)strlen(hello)+1;

    c_stream.zalloc = zalloc;
    c_stream.zfree = zfree;
    c_stream.opaque = (voidpf)0;

    err = deflateInit(&c_stream, Z_DEFAULT_COMPRESSION);
    CHECK_ERR(err, "deflateInit");

    c_stream.next_in  = (z_const unsigned char *)hello;
    c_stream.next_out = compr;
    c_stream.avail_in = 3;
    c_stream.avail_out = (uInt)*comprLen;
    err = deflate(&c_stream, Z_FULL_FLUSH);
    CHECK_ERR(err, "deflate");

    compr[3]++; /* force an error in first compressed block */
    c_stream.avail_in = len - 3;

    err = deflate(&c_stream, Z_FINISH);
    if (err != Z_STREAM_END) {
        CHECK_ERR(err, "deflate");
    }
    err = deflateEnd(&c_stream);
    CHECK_ERR(err, "deflateEnd");

    *comprLen = c_stream.total_out;
}